

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  nn_fsm **self;
  nn_fsm **self_00;
  nn_efd *self_01;
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  pollfd *__fds;
  int *piVar4;
  nn_pool *pool;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 *puVar5;
  nn_ep *in_RCX;
  nn_ep *self_02;
  uint extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  long lVar6;
  undefined4 in_register_00000034;
  nn_fsm *self_03;
  undefined4 *puVar7;
  long *plVar8;
  nn_list *self_04;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  int fd;
  size_t sz;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  
  lVar6 = CONCAT44(in_register_00000034,nfds);
  self_03 = (nn_fsm *)((long)nfds << 4);
  __fds = (pollfd *)nn_alloc_((size_t)self_03);
  if (__fds != (pollfd *)0x0) {
    if (nfds == 0) {
      iVar2 = 0;
      iVar10 = poll(__fds,0,timeout);
      if (iVar10 < 1) goto LAB_0011f568;
    }
    else {
      uVar9 = 0;
      iVar10 = 0;
      local_38 = nfds;
      local_34 = timeout;
      do {
        uVar1 = fds[uVar9].events;
        if ((uVar1 & 1) != 0) {
          local_40 = 4;
          self_03 = (nn_fsm *)(ulong)(uint)fds[uVar9].fd;
          lVar6 = 0;
          in_RCX = (nn_ep *)&stack0xffffffffffffffbc;
          iVar2 = nn_getsockopt(fds[uVar9].fd,0,0xb,in_RCX,&stack0xffffffffffffffc0);
          if (iVar2 < 0) goto LAB_0011f59f;
          if (local_40 == 4) {
            __fds[iVar10].fd = local_44;
            __fds[iVar10].events = 1;
            iVar10 = iVar10 + 1;
            uVar1 = fds[uVar9].events;
            goto LAB_0011f46d;
          }
          nn_poll_cold_1();
LAB_0011f5b4:
          nn_poll_cold_2();
          goto LAB_0011f5b9;
        }
LAB_0011f46d:
        if ((uVar1 & 2) != 0) {
          local_40 = 4;
          self_03 = (nn_fsm *)(ulong)(uint)fds[uVar9].fd;
          lVar6 = 0;
          in_RCX = (nn_ep *)&stack0xffffffffffffffbc;
          iVar2 = nn_getsockopt(fds[uVar9].fd,0,10,in_RCX,&stack0xffffffffffffffc0);
          if (iVar2 < 0) {
LAB_0011f59f:
            nn_free(__fds);
            return -1;
          }
          if (local_40 != 4) goto LAB_0011f5b4;
          __fds[iVar10].fd = local_44;
          __fds[iVar10].events = 1;
          iVar10 = iVar10 + 1;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)nfds != uVar9);
      iVar10 = poll(__fds,(long)iVar10,local_34);
      if (iVar10 < 1) {
LAB_0011f568:
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        nn_free(__fds);
        *piVar4 = iVar2;
        return iVar10;
      }
      if (local_38 == 0) {
        iVar2 = 0;
      }
      else {
        uVar9 = 0;
        iVar2 = 0;
        iVar10 = 0;
        do {
          fds[uVar9].revents = 0;
          if ((fds[uVar9].events & 1U) == 0) {
            uVar1 = 0;
          }
          else {
            bVar11 = (__fds[iVar10].revents & 1) != 0;
            if (bVar11) {
              fds[uVar9].revents = 1;
            }
            uVar1 = (ushort)bVar11;
            iVar10 = iVar10 + 1;
          }
          if ((fds[uVar9].events & 2U) != 0) {
            if ((__fds[iVar10].revents & 1) != 0) {
              uVar1 = uVar1 | 2;
              fds[uVar9].revents = uVar1;
            }
            iVar10 = iVar10 + 1;
          }
          iVar2 = (iVar2 + 1) - (uint)(uVar1 == 0);
          uVar9 = uVar9 + 1;
        } while ((uint)nfds != uVar9);
      }
    }
    nn_free(__fds);
    return iVar2;
  }
LAB_0011f5b9:
  nn_poll_cold_3();
  if ((~*(uint *)(lVar6 + 8) & 3) == 0) {
    nn_sock_init_cold_2();
    iVar10 = (int)lVar6;
    uVar3 = extraout_EAX;
  }
  else {
    self = &self_03[1].owner;
    pool = nn_global_getpool();
    nn_ctx_init((nn_ctx *)self,pool,nn_sock_onleave);
    in_RCX = (nn_ep *)self;
    nn_fsm_init_root(self_03,nn_sock_handler,nn_sock_shutdown,(nn_ctx *)self);
    *(undefined4 *)&self_03[1].fn = 1;
    self_00 = &self_03[2].owner;
    if ((*(byte *)(lVar6 + 8) & 2) == 0) {
      iVar10 = nn_efd_init((nn_efd *)self_00);
      if (iVar10 < 0) {
        return iVar10;
      }
    }
    else {
      *(undefined4 *)self_00 = 0xcdcdcdcd;
    }
    self_01 = (nn_efd *)((long)&self_03[2].owner + 4);
    if ((*(byte *)(lVar6 + 8) & 1) == 0) {
      iVar10 = nn_efd_init(self_01);
      if (iVar10 < 0) {
        if ((*(byte *)(lVar6 + 8) & 2) != 0) {
          return iVar10;
        }
        nn_efd_term((nn_efd *)self_00);
        return iVar10;
      }
    }
    else {
      self_01->efd = -0x32323233;
    }
    nn_sem_init((nn_sem *)&self_03[2].ctx);
    nn_sem_init((nn_sem *)&self_03[2].stopped.type);
    *(undefined4 *)((long)&self_03[3].stopped.fsm + 4) = 1;
    *(undefined4 *)&self_03[1].srcptr = 0;
    nn_list_init((nn_list *)&self_03[3].state);
    nn_list_init((nn_list *)&self_03[3].owner);
    *(undefined4 *)&self_03[3].stopped.fsm = 1;
    *(undefined8 *)&self_03[3].stopped.src = 0x2000000020000;
    self_03[3].stopped.srcptr = (void *)0xffffffff00100000;
    *(undefined8 *)&self_03[3].stopped.type = 0x64ffffffff;
    self_03[3].stopped.item.next = (nn_queue_item *)0x800000000;
    self_03[4].fn = (nn_fsm_fn)0x800000008;
    *(undefined4 *)&self_03[4].shutdown_fn = 1;
    self_03[4].stopped.fsm = (nn_fsm *)0x0;
    *(undefined8 *)&self_03[4].stopped.src = 0;
    self_03[4].stopped.srcptr = (void *)0x0;
    *(undefined8 *)&self_03[4].stopped.type = 0;
    self_03[4].stopped.item.next = (nn_queue_item *)0x0;
    self_03[5].fn = (nn_fsm_fn)0x0;
    self_03[5].shutdown_fn = (nn_fsm_fn)0x0;
    self_03[5].state = 0;
    self_03[5].src = 0;
    self_03[5].srcptr = (void *)0x0;
    self_03[5].owner = (nn_fsm *)0x0;
    self_03[5].ctx = (nn_ctx *)0x0;
    self_03[5].stopped.fsm = (nn_fsm *)0x0;
    *(undefined8 *)&self_03[5].stopped.src = 0;
    sprintf((char *)&self_03[5].stopped.srcptr,"%d",(ulong)extraout_EDX);
    self_03[6].ctx = (nn_ctx *)0x0;
    self_03[6].stopped.fsm = (nn_fsm *)0x0;
    *(undefined8 *)&self_03[6].stopped.src = 0x100000001000;
    self_03[4].state = 0;
    self_03[4].src = 0;
    self_03[4].srcptr = (void *)0x0;
    self_03[4].owner = (nn_fsm *)0x0;
    self_03[4].ctx = (nn_ctx *)0x0;
    iVar10 = (int)self_03 + 0x60;
    uVar3 = (**(code **)(lVar6 + 0x10))(self_03);
    if (uVar3 == 0) {
      self_03[1].state = (int)lVar6;
      self_03[1].src = (int)((ulong)lVar6 >> 0x20);
      nn_ctx_enter((nn_ctx *)self);
      nn_fsm_start(self_03);
      nn_ctx_leave((nn_ctx *)self);
      return 0;
    }
  }
  uVar9 = (ulong)uVar3;
  nn_sock_init_cold_1();
  lVar6 = uVar9 - 0x78;
  if (uVar9 == 0) {
    lVar6 = 0;
  }
  if (*(int *)(lVar6 + 0x58) != 2) {
    return extraout_EAX_00;
  }
  uVar3 = (**(code **)(**(long **)(lVar6 + 0x60) + 0x30))();
  if (-1 < (int)uVar3) {
    nn_sock_onleave_cold_1();
    return extraout_EAX_01;
  }
  uVar9 = (ulong)uVar3;
  nn_sock_onleave_cold_2();
  puVar7 = (undefined4 *)(uVar9 + 0x58);
  uVar3 = *(uint *)(uVar9 + 0x58);
  self_02 = (nn_ep *)(ulong)uVar3;
  if (uVar3 == 2) {
    if (iVar10 == 1) {
      iVar10 = extraout_EDX_00;
      if (extraout_EDX_00 == 1) {
        nn_list_erase((nn_list *)(uVar9 + 0x128),&in_RCX->item);
        nn_ep_term(in_RCX);
        nn_free(in_RCX);
        return extraout_EAX_02;
      }
      goto LAB_0011f897;
    }
    if (iVar10 == -2) goto LAB_0011f890;
    if (extraout_EDX_00 == 0x84c4) {
      plVar8 = *(long **)(uVar9 + 0x60);
      UNRECOVERED_JUMPTABLE = *(code **)(*plVar8 + 0x28);
LAB_0011f879:
      iVar10 = (*UNRECOVERED_JUMPTABLE)(plVar8,in_RCX);
      return iVar10;
    }
    if (extraout_EDX_00 == 0x84c3) {
      plVar8 = *(long **)(uVar9 + 0x60);
      UNRECOVERED_JUMPTABLE = *(code **)(*plVar8 + 0x20);
      goto LAB_0011f879;
    }
  }
  else {
    if (uVar3 == 1) {
      if (iVar10 != -2) goto LAB_0011f884;
      if (extraout_EDX_00 == -2) {
        *puVar7 = 2;
        return (int)uVar9;
      }
    }
    else {
      nn_sock_handler_cold_6();
LAB_0011f884:
      nn_sock_handler_cold_4();
    }
    nn_sock_handler_cold_5();
LAB_0011f890:
    nn_sock_handler_cold_2();
    iVar10 = extraout_EDX_01;
LAB_0011f897:
    nn_sock_handler_cold_1();
  }
  nn_sock_handler_cold_3();
  uVar3 = puVar7[0x16];
  self_04 = (nn_list *)(ulong)uVar3;
  if (extraout_EDX_02 == -3 && iVar10 == -2) {
LAB_0011f8db:
    nn_sock_shutdown_cold_3();
  }
  else {
    if (uVar3 != 3) {
      if (uVar3 == 4) {
        if ((iVar10 != -2) || (extraout_EDX_02 != 1)) {
          nn_sock_shutdown_cold_1();
          goto LAB_0011f98f;
        }
        puVar5 = (undefined8 *)**(undefined8 **)(puVar7 + 0x18);
        goto LAB_0011f96a;
      }
      nn_sock_shutdown_cold_2();
      goto LAB_0011f8db;
    }
    if (extraout_EDX_02 != 1 || iVar10 != 1) {
      return (int)puVar7 + 0x58;
    }
    nn_list_erase((nn_list *)(puVar7 + 0x4a),&self_02->item);
    nn_ep_term(self_02);
    nn_free(self_02);
  }
  iVar10 = nn_list_empty((nn_list *)(puVar7 + 0x4a));
  if (iVar10 == 0) {
    return 0;
  }
  self_04 = (nn_list *)(puVar7 + 0x46);
  iVar10 = nn_list_empty(self_04);
  if (iVar10 == 0) {
LAB_0011f98f:
    nn_sock_shutdown_cold_4();
    self_04[3].first = (nn_list_item *)self_04;
    *(undefined4 *)&self_04[3].last = 0xfffffffe;
    self_04[4].first = (nn_list_item *)0x0;
    *(undefined4 *)&self_04[4].last = 1;
    nn_ctx_raise((nn_ctx *)self_04[2].last,(nn_fsm_event *)(self_04 + 3));
    return extraout_EAX_04;
  }
  puVar7[0x16] = 4;
  puVar5 = (undefined8 *)**(undefined8 **)(puVar7 + 0x18);
  if ((code *)*puVar5 != (code *)0x0) {
    iVar10 = (*(code *)*puVar5)();
    return iVar10;
  }
LAB_0011f96a:
  (*(code *)puVar5[1])();
  puVar7[0x16] = 5;
  nn_sem_post((nn_sem *)(puVar7 + 0x36));
  return extraout_EAX_03;
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}